

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O2

uint __thiscall
Lib::
BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
::bubbleUp(BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
           *this,uint index)

{
  ulong uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  undefined4 uVar4;
  uint uVar5;
  undefined4 uVar6;
  ulong uVar7;
  Binding *pBVar8;
  Binding *pBVar9;
  
  uVar7 = (ulong)index;
  while( true ) {
    if ((uint)uVar7 < 2) {
      return 1;
    }
    uVar1 = uVar7 >> 1;
    pBVar9 = this->_data1;
    if (pBVar9[uVar7].var <= pBVar9[uVar1].var) break;
    pBVar8 = pBVar9 + uVar7;
    pBVar9 = pBVar9 + uVar1;
    uVar5 = pBVar8->var;
    uVar6 = *(undefined4 *)&pBVar8->field_0x4;
    uVar2 = (pBVar8->term)._content;
    uVar4 = *(undefined4 *)&pBVar9->field_0x4;
    uVar3 = (pBVar9->term)._content;
    pBVar8->var = pBVar9->var;
    *(undefined4 *)&pBVar8->field_0x4 = uVar4;
    (pBVar8->term)._content = uVar3;
    pBVar9->var = uVar5;
    *(undefined4 *)&pBVar9->field_0x4 = uVar6;
    (pBVar9->term)._content = uVar2;
    uVar7 = uVar1;
  }
  return (uint)uVar7;
}

Assistant:

unsigned bubbleUp(unsigned index)
  {
    ASS(index>0 && index<=_size);
    unsigned nextIndex=index>>1;
    while(nextIndex) {
      if(Comparator::compare(_data1[index], _data1[nextIndex])==LESS) {
	std::swap(_data1[index], _data1[nextIndex]);
      } else {
	return index;
      }
      index=nextIndex;
      nextIndex=index>>1;
    }
    return 1;
  }